

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ImmediateAssertionStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ImmediateAssertionStatement,slang::ast::AssertionKind&,slang::ast::Expression_const&,slang::ast::Statement_const*&,slang::ast::Statement_const*&,bool&,bool&,slang::SourceRange>
          (BumpAllocator *this,AssertionKind *args,Expression *args_1,Statement **args_2,
          Statement **args_3,bool *args_4,bool *args_5,SourceRange *args_6)

{
  bool bVar1;
  bool bVar2;
  AssertionKind AVar3;
  Statement *pSVar4;
  Statement *pSVar5;
  SourceLocation SVar6;
  SourceLocation SVar7;
  ImmediateAssertionStatement *pIVar8;
  
  pIVar8 = (ImmediateAssertionStatement *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ImmediateAssertionStatement *)this->endPtr < pIVar8 + 1) {
    pIVar8 = (ImmediateAssertionStatement *)allocateSlow(this,0x40,8);
  }
  else {
    this->head->current = (byte *)(pIVar8 + 1);
  }
  AVar3 = *args;
  pSVar4 = *args_2;
  pSVar5 = *args_3;
  bVar1 = *args_4;
  bVar2 = *args_5;
  SVar6 = args_6->startLoc;
  SVar7 = args_6->endLoc;
  (pIVar8->super_Statement).kind = ImmediateAssertion;
  (pIVar8->super_Statement).syntax = (StatementSyntax *)0x0;
  (pIVar8->super_Statement).sourceRange.startLoc = SVar6;
  (pIVar8->super_Statement).sourceRange.endLoc = SVar7;
  pIVar8->cond = args_1;
  pIVar8->ifTrue = pSVar4;
  pIVar8->ifFalse = pSVar5;
  pIVar8->assertionKind = AVar3;
  pIVar8->isDeferred = bVar1;
  pIVar8->isFinal = bVar2;
  return pIVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }